

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

xml_node<char> * __thiscall
ki::dml::
Field<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
::as_xml(Field<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
         *this,xml_document<char> *doc)

{
  char *pcVar1;
  memory_pool<char> *pmVar2;
  xml_node<char> *this_00;
  xml_attribute<char> *pxVar3;
  xml_attribute<char> *noxfer_attr;
  xml_attribute<char> *type_attr;
  char *type_attr_value_buffer;
  xml_node<char> *node;
  undefined1 local_48 [40];
  char *value_buffer;
  char *name_buffer;
  xml_document<char> *doc_local;
  Field<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  *this_local;
  
  name_buffer = (char *)doc;
  doc_local = (xml_document<char> *)this;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  value_buffer = rapidxml::memory_pool<char>::allocate_string
                           (&doc->super_memory_pool<char>,pcVar1,0);
  pmVar2 = (memory_pool<char> *)(name_buffer + 0x60);
  get_value_string((Field<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                    *)local_48);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = rapidxml::memory_pool<char>::allocate_string(pmVar2,pcVar1,0);
  std::__cxx11::string::~string((string *)local_48);
  local_48._32_8_ = pcVar1;
  this_00 = rapidxml::memory_pool<char>::allocate_node
                      ((memory_pool<char> *)(name_buffer + 0x60),node_element,value_buffer,pcVar1,0,
                       0);
  pmVar2 = (memory_pool<char> *)(name_buffer + 0x60);
  pcVar1 = get_type_name(this);
  pcVar1 = rapidxml::memory_pool<char>::allocate_string(pmVar2,pcVar1,0);
  pxVar3 = rapidxml::memory_pool<char>::allocate_attribute
                     ((memory_pool<char> *)(name_buffer + 0x60),"TYPE",pcVar1,0,0);
  rapidxml::xml_node<char>::append_attribute(this_00,pxVar3);
  if (((this->super_FieldBase).m_transferable & 1U) == 0) {
    pxVar3 = rapidxml::memory_pool<char>::allocate_attribute
                       ((memory_pool<char> *)(name_buffer + 0x60),"NOXFER","TRUE",0,0);
    rapidxml::xml_node<char>::append_attribute(this_00,pxVar3);
  }
  return this_00;
}

Assistant:

rapidxml::xml_node<> *as_xml(rapidxml::xml_document<> &doc) const final
		{
			// Create the node:
			// Copy our current name and value into buffers that are
			// lifetime-dependant on the xml_document, rather than this Field.
			char *name_buffer = doc.allocate_string(m_name.c_str(), 0);
			char *value_buffer = doc.allocate_string(get_value_string().c_str(), 0);
			auto *node = doc.allocate_node(
				rapidxml::node_type::node_element, name_buffer, value_buffer);

			// Create the TYPE attribute
			char *type_attr_value_buffer = doc.allocate_string(get_type_name(), 0);
			auto *type_attr = doc.allocate_attribute("TYPE", type_attr_value_buffer);
			node->append_attribute(type_attr);

			// If we're not transferable, set NOXFER to TRUE
			// NOXFER defaults to FALSE, so we don't need to write it otherwise.
			if (!m_transferable)
			{
				auto *noxfer_attr = doc.allocate_attribute("NOXFER", "TRUE");
				node->append_attribute(noxfer_attr);
			}

			return node;
		}